

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdcpp.hpp
# Opt level: O1

unique_ptr<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>_>_>
 __thiscall
so_5::stdcpp::
make_unique<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>,std::__cxx11::string_const&>
          (stdcpp *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pcVar1;
  disp_binder_t *this_00;
  _func_int **local_48;
  _func_int **local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  _func_int **pp_Stack_30;
  
  this_00 = (disp_binder_t *)operator_new(0x28);
  pcVar1 = (args->_M_dataplus)._M_p;
  local_48 = (_func_int **)&local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + args->_M_string_length);
  disp_binder_t::disp_binder_t(this_00);
  this_00->_vptr_disp_binder_t = (_func_int **)&PTR__binder_for_public_disp_template_t_0028eed8;
  this_00[1]._vptr_disp_binder_t = (_func_int **)(this_00 + 3);
  if (local_48 == (_func_int **)&local_38) {
    this_00[3]._vptr_disp_binder_t = (_func_int **)CONCAT71(uStack_37,local_38);
    this_00[4]._vptr_disp_binder_t = pp_Stack_30;
  }
  else {
    this_00[1]._vptr_disp_binder_t = local_48;
    this_00[3]._vptr_disp_binder_t = (_func_int **)CONCAT71(uStack_37,local_38);
  }
  this_00[2]._vptr_disp_binder_t = local_40;
  *(disp_binder_t **)this = this_00;
  return (__uniq_ptr_data<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>_>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>,_std::default_delete<so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< T >
make_unique( ARGS && ...args )
	{
		return std::unique_ptr< T >( new T( std::forward<ARGS>(args)... ) );
	}